

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void vpermt2b(PDISASM pMyDisasm)

{
  undefined8 uVar1;
  
  if (((pMyDisasm->Reserved_).EVEX.state == '\x01') && ((pMyDisasm->Reserved_).VEX.pp == '\x01')) {
    (pMyDisasm->Instruction).Category = 0x140000;
    if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
      uVar1 = 0x6232746d72657076;
    }
    else {
      uVar1 = 0x7732746d72657076;
    }
    *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar1;
    (pMyDisasm->Instruction).Mnemonic[8] = '\0';
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x03';
    ArgsVEX(pMyDisasm);
    return;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ vpermt2b(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpermt2b");
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpermt2w");
        #endif
      }
      GV.EVEX.tupletype = FULL_MEM;
      ArgsVEX(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}